

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O2

void __thiscall ruckig::RuckigError::RuckigError(RuckigError *this,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"\n[ruckig] ",message);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)this = &PTR__runtime_error_001b8640;
  return;
}

Assistant:

explicit RuckigError(const std::string& message): std::runtime_error("\n[ruckig] " + message) { }